

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# prob.cpp
# Opt level: O1

double bessel_i1(double arg)

{
  long lVar1;
  double dVar2;
  double dVar3;
  double dVar4;
  double dVar5;
  
  dVar4 = ABS(arg);
  dVar2 = r8_epsilon();
  if (dVar2 <= dVar4) {
    if (15.0 <= dVar4) {
      if (dVar4 <= 713.987) {
        dVar3 = 1.0 / dVar4 + -0.06666666666666667;
        dVar2 = dVar4;
        if (698.987 < dVar4) {
          dVar2 = dVar4 + -40.0;
        }
        dVar5 = *(double *)(&DAT_0021a840 + (ulong)(698.987 < dVar4) * 8);
        dVar2 = exp(dVar2);
        if (dVar4 < 0.0) {
          dVar4 = sqrt(dVar4);
        }
        else {
          dVar4 = SQRT(dVar4);
        }
        dVar5 = dVar5 * ((dVar2 * 0.3984375 +
                         ((((((((dVar3 * -0.0604371590561376 + 0.4574812290193346) * dVar3 +
                               -0.4284376690330481) * dVar3 + 0.0973560001508866) * dVar3 +
                             -0.0032457723974465566) * dVar3 + -0.00036395264712121795) * dVar3 +
                           1.6258661867440838e-05) * dVar3 + -3.634757840460822e-07) /
                         ((((((dVar3 + -3.8806586721556595) * dVar3 + 3.2593714889036995) * dVar3 +
                            -0.8501747646321792) * dVar3 + 0.07421201081318653) * dVar3 +
                          -0.0022835624489492513) * dVar3 + 3.751043311192282e-05)) * dVar2) / dVar4
                        );
      }
      else {
        dVar5 = 1e+30;
      }
      goto LAB_001926a5;
    }
    dVar5 = -1.970529180253514e-19;
    lVar1 = 1;
    do {
      dVar5 = dVar5 * arg * arg + *(double *)(&DAT_0021c9a0 + lVar1 * 8);
      lVar1 = lVar1 + 1;
    } while (lVar1 != 0xf);
    dVar2 = arg * arg + -225.0;
    dVar5 = dVar5 / (((((dVar2 + -4007.686467990419) * dVar2 + 7481058.0356655065) * dVar2 +
                      -8005951899.861977) * dVar2 + 4854471425827.362) * dVar2 + -1321816830732144.2
                    );
  }
  else {
    dVar5 = 0.5;
  }
  dVar5 = dVar5 * dVar4;
LAB_001926a5:
  return (double)(~-(ulong)(arg < 0.0) & (ulong)dVar5 | (ulong)-dVar5 & -(ulong)(arg < 0.0));
}

Assistant:

double bessel_i1 ( double arg )

//****************************************************************************80
//
//  Purpose:
//
//    BESSEL_I1 evaluates the Bessel I function of order I.
//
//  Discussion:
//
//    The main computation evaluates slightly modified forms of
//    minimax approximations generated by Blair and Edwards.
//    This transportable program is patterned after the machine-dependent
//    FUNPACK packet NATSI1, but cannot match that version for efficiency
//    or accuracy.  This version uses rational functions that theoretically
//    approximate I-SUB-1(X) to at least 18 significant decimal digits.
//    The accuracy achieved depends on the arithmetic system, the compiler,
//    the intrinsic functions, and proper selection of the machine-dependent
//    constants.
//
//  Machine-dependent constants:
//
//    beta   = Radix for the floating-point system.
//    maxexp = Smallest power of beta that overflows.
//    XMAX =   Largest argument acceptable to BESI1;  Solution to
//             equation:
//               EXP(X) * (1-3/(8*X)) / SQRT(2*PI*X) = beta^maxexp
//
//
//    Approximate values for some important machines are:
//
//                            beta       maxexp    XMAX
//
//    CRAY-1        (S.P.)       2         8191    5682.810
//    Cyber 180/855
//      under NOS   (S.P.)       2         1070     745.894
//    IEEE (IBM/XT,
//      SUN, etc.)  (S.P.)       2          128      91.906
//    IEEE (IBM/XT,
//      SUN, etc.)  (D.P.)       2         1024     713.987
//    IBM 3033      (D.P.)      16           63     178.185
//    VAX           (S.P.)       2          127      91.209
//    VAX D-Format  (D.P.)       2          127      91.209
//    VAX G-Format  (D.P.)       2         1023     713.293
//
//  Licensing:
//
//    This code is distributed under the GNU LGPL license.
//
//  Modified:
//
//    28 October 2004
//
//  Author:
//
//    Original FORTRAN77 version by William Cody, Laura Stoltz,
//    C++ version by John Burkardt.
//
//  Reference:
//
//    Blair, Edwards,
//    Chalk River Report AECL-4928,
//    Atomic Energy of Canada, Limited,
//    October, 1974.
//
//  Parameters:
//
//    Input, double ARG, the argument.
//
//    Output, double BESSEL_I1, the value of the Bessel
//    I1 function.
//
{
  double a;
  double b;
  double exp40 = 2.353852668370199854E+17;
  double forty = 40.0;
  double half = 0.5;
  int j;
  double one = 1.0;
  double one5 = 15.0;
  double p[15] = {
    -1.9705291802535139930E-19,
    -6.5245515583151902910E-16,
    -1.1928788903603238754E-12,
    -1.4831904935994647675E-09,
    -1.3466829827635152875E-06,
    -9.1746443287817501309E-04,
    -4.7207090827310162436E-01,
    -1.8225946631657315931E+02,
    -5.1894091982308017540E+04,
    -1.0588550724769347106E+07,
    -1.4828267606612366099E+09,
    -1.3357437682275493024E+11,
    -6.9876779648010090070E+12,
    -1.7732037840791591320E+14,
    -1.4577180278143463643E+15 };
  double pbar = 3.98437500E-01;
  double pp[8] = {
    -6.0437159056137600000E-02,
     4.5748122901933459000E-01,
    -4.2843766903304806403E-01,
     9.7356000150886612134E-02,
    -3.2457723974465568321E-03,
    -3.6395264712121795296E-04,
     1.6258661867440836395E-05,
    -3.6347578404608223492E-07 };
  double q[5] = {
    -4.0076864679904189921E+03,
     7.4810580356655069138E+06,
    -8.0059518998619764991E+09,
     4.8544714258273622913E+12,
    -1.3218168307321442305E+15 };
  double qq[6] = {
    -3.8806586721556593450,
     3.2593714889036996297,
    -8.5017476463217924408E-01,
     7.4212010813186530069E-02,
    -2.2835624489492512649E-03,
     3.7510433111922824643E-05 };
  double r8_huge = 1.0E+30;
  double rec15 = 6.6666666666666666666E-02;
  double sump;
  double sumq;
  double two25 = 225.0;
  double value;
  double x;
  double xmax = 713.987;
  double xx;
  double zero = 0.0;

  x = fabs ( arg );
//
//  ABS(ARG) < EPSILON ( ARG )
//
  if ( x < r8_epsilon ( ) )
  {
    value = half * x;
  }
//
//  EPSILON ( ARG ) <= ABS(ARG) < 15.0
//
  else if ( x < one5 )
  {
    xx = x * x;
    sump = p[0];
    for ( j = 1; j < 15; j++ )
    {
      sump = sump * xx + p[j];
    }

    xx = xx - two25;

    sumq = ((((
          xx + q[0]
      ) * xx + q[1]
      ) * xx + q[2]
      ) * xx + q[3]
      ) * xx + q[4];

    value = ( sump / sumq ) * x;
  }
  else if ( xmax < x )
  {
    value = r8_huge;
  }
//
//  15.0 <= ABS(ARG)
//
  else
  {
    xx = one / x - rec15;

    sump = ((((((
               pp[0]
        * xx + pp[1]
      ) * xx + pp[2]
      ) * xx + pp[3]
      ) * xx + pp[4]
      ) * xx + pp[5]
      ) * xx + pp[6]
      ) * xx + pp[7];

    sumq = (((((
          xx + qq[0]
      ) * xx + qq[1]
      ) * xx + qq[2]
      ) * xx + qq[3]
      ) * xx + qq[4]
      ) * xx + qq[5];

    value = sump / sumq;

    if ( xmax - one5 < x )
    {
      a = exp ( x - forty );
      b = exp40;
    }
    else
    {
      a = exp ( x );
      b = one;
    }
    value = ( ( value * a + pbar * a ) / sqrt ( x ) ) * b;
  }

  if ( arg < zero )
  {
    value = - value;
  }

  return value;
}